

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseActionCommand(WastParser *this,CommandPtr *out_command)

{
  bool bVar1;
  Result result;
  pointer pAVar2;
  unique_ptr<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
  local_28;
  __single_object command;
  CommandPtr *out_command_local;
  WastParser *this_local;
  
  command._M_t.
  super___uniq_ptr_impl<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
  .super__Head_base<0UL,_wabt::ActionCommandBase<(wabt::CommandType)2>_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>,_true,_true>
        )(__uniq_ptr_data<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>,_true,_true>
          )out_command;
  std::make_unique<wabt::ActionCommandBase<(wabt::CommandType)2>>();
  pAVar2 = std::
           unique_ptr<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
           ::operator->(&local_28);
  result = ParseAction(this,&pAVar2->action);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>::operator=
              ((unique_ptr<wabt::Command,std::default_delete<wabt::Command>> *)
               command._M_t.
               super___uniq_ptr_impl<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::ActionCommandBase<(wabt::CommandType)2>_*,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
               .super__Head_base<0UL,_wabt::ActionCommandBase<(wabt::CommandType)2>_*,_false>.
               _M_head_impl,&local_28);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  std::
  unique_ptr<wabt::ActionCommandBase<(wabt::CommandType)2>,_std::default_delete<wabt::ActionCommandBase<(wabt::CommandType)2>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseActionCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseActionCommand);
  auto command = std::make_unique<ActionCommand>();
  CHECK_RESULT(ParseAction(&command->action));
  *out_command = std::move(command);
  return Result::Ok;
}